

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint aom_highbd_8_variance4x8_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  ulong *puVar11;
  ulong *puVar12;
  int iVar13;
  int iVar14;
  uint32_t uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  puVar11 = (ulong *)((long)b * 2);
  puVar12 = (ulong *)((long)a * 2);
  uVar15 = 0;
  iVar13 = 8;
  iVar14 = 0;
  do {
    uVar1 = *puVar12;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3._12_2_ = (short)(uVar1 >> 0x30);
    auVar5._8_2_ = (short)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._10_4_ = auVar3._10_4_;
    auVar9._6_8_ = 0;
    auVar9._0_6_ = auVar5._8_6_;
    auVar7._4_2_ = (short)(uVar1 >> 0x10);
    auVar7._0_4_ = (uint)uVar1;
    auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
    uVar2 = *puVar11;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4._12_2_ = (short)(uVar2 >> 0x30);
    auVar6._8_2_ = (short)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._10_4_ = auVar4._10_4_;
    auVar10._6_8_ = 0;
    auVar10._0_6_ = auVar6._8_6_;
    auVar8._4_2_ = (short)(uVar2 >> 0x10);
    auVar8._0_4_ = (uint)uVar2;
    auVar8._6_8_ = SUB148(auVar10 << 0x40,6);
    auVar16._0_4_ = ((uint)uVar1 & 0xffff) - ((uint)uVar2 & 0xffff);
    auVar16._4_4_ = auVar7._4_4_ - auVar8._4_4_;
    auVar16._8_4_ = auVar5._8_4_ - auVar6._8_4_;
    auVar16._12_4_ = (auVar3._10_4_ >> 0x10) - (auVar4._10_4_ >> 0x10);
    auVar17._4_4_ = auVar16._4_4_;
    auVar17._0_4_ = auVar16._4_4_;
    auVar17._8_4_ = auVar16._12_4_;
    auVar17._12_4_ = auVar16._12_4_;
    iVar14 = iVar14 + auVar16._12_4_ + auVar16._4_4_ + auVar16._8_4_ + auVar16._0_4_;
    uVar15 = (int)((auVar17._8_8_ & 0xffffffff) * (auVar17._8_8_ & 0xffffffff)) +
             auVar16._4_4_ * auVar16._4_4_ +
             (int)((auVar16._8_8_ & 0xffffffff) * (auVar16._8_8_ & 0xffffffff)) +
             auVar16._0_4_ * auVar16._0_4_ + uVar15;
    puVar12 = (ulong *)((long)puVar12 + (long)a_stride * 2);
    puVar11 = (ulong *)((long)puVar11 + (long)b_stride * 2);
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  *sse = uVar15;
  return uVar15 - (int)((ulong)((long)iVar14 * (long)iVar14) >> 5);
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}